

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nest_One_IAF_SNN_Results.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int param;
  char local_res13;
  
  iVar1 = run();
  return iVar1;
}

Assistant:

int main() 
{
    try {
        return run();
    }
    catch (int param) { cout << "int exception"; }
    catch (char param) { cout << "char exception"; }
    catch (...) { cout << "default exception"; }
}